

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeExprOrVector(Parse *pParse,Expr *p,int iReg,int nReg)

{
  ExprList *pEVar1;
  Vdbe *p_00;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (p != (Expr *)0x0) {
    iVar2 = sqlite3ExprIsVector(p);
    if (iVar2 != 0) {
      if ((p->flags & 0x800) == 0) {
        pEVar1 = (p->x).pList;
        uVar3 = 0;
        uVar4 = (ulong)(uint)nReg;
        if (nReg < 1) {
          uVar4 = uVar3;
        }
        for (; uVar4 * 0x20 != uVar3; uVar3 = uVar3 + 0x20) {
          sqlite3ExprCode(pParse,*(Expr **)((long)&pEVar1->a[0].pExpr + uVar3),iReg);
          iReg = iReg + 1;
        }
        return;
      }
      p_00 = pParse->pVdbe;
      iVar2 = sqlite3CodeSubselect(pParse,p,0,0);
      sqlite3VdbeAddOp3(p_00,0x4e,iVar2,iReg,nReg + -1);
      return;
    }
  }
  sqlite3ExprCode(pParse,p,iReg);
  return;
}

Assistant:

static void codeExprOrVector(Parse *pParse, Expr *p, int iReg, int nReg){
  assert( nReg>0 );
  if( p && sqlite3ExprIsVector(p) ){
#ifndef SQLITE_OMIT_SUBQUERY
    if( (p->flags & EP_xIsSelect) ){
      Vdbe *v = pParse->pVdbe;
      int iSelect = sqlite3CodeSubselect(pParse, p, 0, 0);
      sqlite3VdbeAddOp3(v, OP_Copy, iSelect, iReg, nReg-1);
    }else
#endif
    {
      int i;
      ExprList *pList = p->x.pList;
      assert( nReg<=pList->nExpr );
      for(i=0; i<nReg; i++){
        sqlite3ExprCode(pParse, pList->a[i].pExpr, iReg+i);
      }
    }
  }else{
    assert( nReg==1 );
    sqlite3ExprCode(pParse, p, iReg);
  }
}